

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::win_set_option(Nvim *this,Window window,string *name,Object *value)

{
  allocator local_51;
  Window local_50;
  string local_48;
  
  local_50 = window;
  std::__cxx11::string::string((string *)&local_48,"nvim_win_set_option",&local_51);
  NvimRPC::
  call<long,std::__cxx11::string,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>
            (&this->client_,&local_48,(nullptr_t)0x0,&local_50,name,value);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void Nvim::win_set_option(Window window, const std::string& name, const Object& value) {
    client_.call("nvim_win_set_option", nullptr, window, name, value);
}